

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O2

void AddOutputs(CMutableTransaction *rawTx,UniValue *outputs_in)

{
  long lVar1;
  string str;
  CScript scriptPubKeyIn;
  pointer ppVar2;
  pointer dest;
  long in_FS_OFFSET;
  undefined8 uStack_168;
  vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
  parsed_outputs;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_148;
  CScript scriptPubKey;
  CTxOut out;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue outputs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  str._M_string_length =
       (size_type)
       parsed_outputs.
       super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  str._M_dataplus._M_p = (pointer)uStack_168;
  str.field_2._M_allocated_capacity =
       (size_type)
       parsed_outputs.
       super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  str.field_2._8_8_ =
       parsed_outputs.
       super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  UniValue::UniValue(&outputs,VOBJ,str);
  std::__cxx11::string::~string((string *)&local_b0);
  NormalizeOutputs((UniValue *)&out,outputs_in);
  UniValue::operator=(&outputs,(UniValue *)&out);
  UniValue::~UniValue((UniValue *)&out);
  ParseOutputs(&parsed_outputs,&outputs);
  ppVar2 = parsed_outputs.
           super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (dest = parsed_outputs.
              super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start; dest != ppVar2; dest = dest + 1) {
    GetScriptForDestination((CScript *)&scriptPubKey.super_CScriptBase,&dest->first);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&local_148,&scriptPubKey.super_CScriptBase);
    scriptPubKeyIn.super_CScriptBase._union._8_8_ =
         parsed_outputs.
         super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect = (char *)uStack_168;
    scriptPubKeyIn.super_CScriptBase._union._16_8_ =
         parsed_outputs.
         super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    scriptPubKeyIn.super_CScriptBase._24_8_ =
         parsed_outputs.
         super__Vector_base<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    CTxOut::CTxOut(&out,&dest->second,scriptPubKeyIn);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_148);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back(&rawTx->vout,&out);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&out.scriptPubKey.super_CScriptBase);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptPubKey.super_CScriptBase);
  }
  std::
  vector<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>,_std::allocator<std::pair<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_long>_>_>
  ::~vector(&parsed_outputs);
  UniValue::~UniValue(&outputs);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddOutputs(CMutableTransaction& rawTx, const UniValue& outputs_in)
{
    UniValue outputs(UniValue::VOBJ);
    outputs = NormalizeOutputs(outputs_in);

    std::vector<std::pair<CTxDestination, CAmount>> parsed_outputs = ParseOutputs(outputs);
    for (const auto& [destination, nAmount] : parsed_outputs) {
        CScript scriptPubKey = GetScriptForDestination(destination);

        CTxOut out(nAmount, scriptPubKey);
        rawTx.vout.push_back(out);
    }
}